

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

void __thiscall cs_impl::any::protect(any *this)

{
  string *str;
  long *in_RDI;
  error *this_00;
  undefined1 local_29 [41];
  
  if (*in_RDI != 0) {
    if (1 < *(short *)(*in_RDI + 2)) {
      str = (string *)__cxa_allocate_exception(0x28);
      this_00 = (error *)local_29;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_29 + 1),"E000G",(allocator *)this_00);
      cov::error::error(this_00,str);
      __cxa_throw(str,&cov::error::typeinfo,cov::error::~error);
    }
    *(undefined2 *)(*in_RDI + 2) = 1;
  }
  return;
}

Assistant:

void protect()
		{
			if (this->mDat != nullptr) {
				if (this->mDat->protect_level > 1)
					throw cov::error("E000G");
				this->mDat->protect_level = 1;
			}
		}